

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O0

void xercesc_4_0::XTemplateSerializer::storeObject
               (RefVectorOf<xercesc_4_0::XercesStep> *objToStore,XSerializeEngine *serEng)

{
  bool bVar1;
  XercesStep *t;
  XercesStep *serObj;
  XercesStep *data;
  XMLSize_t i;
  XMLSize_t vectorLength;
  XSerializeEngine *serEng_local;
  RefVectorOf<xercesc_4_0::XercesStep> *objToStore_local;
  
  bVar1 = XSerializeEngine::needToStoreObject(serEng,objToStore);
  if (bVar1) {
    t = (XercesStep *)
        BaseRefVectorOf<xercesc_4_0::XercesStep>::size
                  (&objToStore->super_BaseRefVectorOf<xercesc_4_0::XercesStep>);
    XSerializeEngine::writeSize(serEng,(XMLSize_t)t);
    for (data = (XercesStep *)0x0; data < t;
        data = (XercesStep *)((long)&(data->super_XSerializable)._vptr_XSerializable + 1)) {
      serObj = BaseRefVectorOf<xercesc_4_0::XercesStep>::elementAt
                         (&objToStore->super_BaseRefVectorOf<xercesc_4_0::XercesStep>,
                          (XMLSize_t)data);
      operator<<(serEng,&serObj->super_XSerializable);
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::storeObject(RefVectorOf<XercesStep>* const objToStore
                                    , XSerializeEngine&              serEng)
{

    if (serEng.needToStoreObject(objToStore))
    {
        XMLSize_t vectorLength = objToStore->size();
        serEng.writeSize (vectorLength);

        for (XMLSize_t i = 0; i < vectorLength; i++)
        {
            XercesStep* data = objToStore->elementAt(i);
            serEng<<data;
        }
    }

}